

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void hts_idx_save_core(hts_idx_t *idx,void *fp,int fmt)

{
  khint_t kVar1;
  void *pvVar2;
  void *pvVar3;
  int32_t local_88;
  undefined8 local_78;
  uint64_t x_4;
  undefined8 uStack_68;
  int32_t x_3;
  uint64_t y;
  bins_t *pbStack_58;
  uint32_t x_2;
  bins_t *p;
  int *piStack_48;
  uint32_t x_1;
  lidx_t *lidx;
  bidx_t *bidx;
  undefined4 local_30;
  khint_t k;
  uint32_t x;
  int is_bgzf;
  int32_t is_be;
  int32_t size;
  int32_t i;
  int fmt_local;
  void *fp_local;
  hts_idx_t *idx_local;
  
  k = (khint_t)(fmt != 1);
  size = fmt;
  _i = fp;
  fp_local = idx;
  x = ed_is_big();
  pvVar2 = _i;
  kVar1 = k;
  if (x == 0) {
    idx_write(k,_i,(void *)((long)fp_local + 0x14),4);
  }
  else {
    local_30 = *(undefined4 *)((long)fp_local + 0x14);
    pvVar3 = ed_swap_4p(&local_30);
    idx_write(kVar1,pvVar2,pvVar3,4);
  }
  if ((size == 2) && (*(int *)((long)fp_local + 0x10) != 0)) {
    idx_write(k,_i,*(void **)((long)fp_local + 0x38),(ulong)*(uint *)((long)fp_local + 0x10));
  }
  for (is_be = 0; pvVar2 = _i, kVar1 = k, is_be < *(int *)((long)fp_local + 0x14); is_be = is_be + 1
      ) {
    lidx = *(lidx_t **)(*(long *)((long)fp_local + 0x28) + (long)is_be * 8);
    piStack_48 = (int *)(*(long *)((long)fp_local + 0x30) + (long)is_be * 0x10);
    if (lidx == (lidx_t *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = lidx->m;
    }
    is_bgzf = local_88;
    if (x == 0) {
      idx_write(k,_i,&is_bgzf,4);
    }
    else {
      p._4_4_ = local_88;
      pvVar3 = ed_swap_4p((void *)((long)&p + 4));
      idx_write(kVar1,pvVar2,pvVar3,4);
    }
    if (lidx != (lidx_t *)0x0) {
      for (bidx._4_4_ = 0; pvVar2 = _i, kVar1 = k, bidx._4_4_ != lidx->n;
          bidx._4_4_ = bidx._4_4_ + 1) {
        if ((*(uint *)(*(long *)(lidx + 1) + (ulong)(bidx._4_4_ >> 4) * 4) >>
             (sbyte)((bidx._4_4_ & 0xf) << 1) & 3) == 0) {
          pbStack_58 = (bins_t *)(*(long *)(lidx + 2) + (ulong)bidx._4_4_ * 0x18);
          if (x == 0) {
            idx_write(k,_i,(void *)((long)lidx[1].offset + (ulong)bidx._4_4_ * 4),4);
            if (size == 0) {
              idx_write(k,_i,(void *)(*(long *)(lidx + 2) + (ulong)bidx._4_4_ * 0x18 + 8),8);
            }
            idx_write(k,_i,&pbStack_58->n,4);
            idx_write(k,_i,pbStack_58->list,(long)(pbStack_58->n << 4));
          }
          else {
            y._4_4_ = *(undefined4 *)((long)lidx[1].offset + (ulong)bidx._4_4_ * 4);
            pvVar3 = ed_swap_4p((void *)((long)&y + 4));
            idx_write(kVar1,pvVar2,pvVar3,4);
            pvVar2 = _i;
            kVar1 = k;
            if (size == 0) {
              uStack_68 = *(undefined8 *)(*(long *)(lidx + 2) + (ulong)bidx._4_4_ * 0x18 + 8);
              pvVar3 = ed_swap_4p(&stack0xffffffffffffff98);
              idx_write(kVar1,pvVar2,pvVar3,8);
            }
            pvVar2 = _i;
            kVar1 = k;
            y._4_4_ = pbStack_58->n;
            pvVar3 = ed_swap_4p((void *)((long)&y + 4));
            idx_write(kVar1,pvVar2,pvVar3,4);
            swap_bins(pbStack_58);
            idx_write(k,_i,pbStack_58->list,(long)(pbStack_58->n << 4));
            swap_bins(pbStack_58);
          }
        }
      }
    }
    pvVar2 = _i;
    kVar1 = k;
    if (size != 0) {
      if (x == 0) {
        idx_write(k,_i,piStack_48,4);
        idx_write(k,_i,*(void **)(piStack_48 + 2),(long)(*piStack_48 << 3));
      }
      else {
        x_4._4_4_ = *piStack_48;
        pvVar3 = ed_swap_4p((void *)((long)&x_4 + 4));
        idx_write(kVar1,pvVar2,pvVar3,4);
        for (x_4._4_4_ = 0; x_4._4_4_ < *piStack_48; x_4._4_4_ = x_4._4_4_ + 1) {
          ed_swap_8p((void *)(*(long *)(piStack_48 + 2) + (long)x_4._4_4_ * 8));
        }
        idx_write(k,_i,*(void **)(piStack_48 + 2),(long)(*piStack_48 << 3));
        for (x_4._4_4_ = 0; x_4._4_4_ < *piStack_48; x_4._4_4_ = x_4._4_4_ + 1) {
          ed_swap_8p((void *)(*(long *)(piStack_48 + 2) + (long)x_4._4_4_ * 8));
        }
      }
    }
  }
  if (x == 0) {
    idx_write(k,_i,(void *)((long)fp_local + 0x20),8);
  }
  else {
    local_78 = *(undefined8 *)((long)fp_local + 0x20);
    idx_write(k,_i,&local_78,8);
  }
  return;
}

Assistant:

static void hts_idx_save_core(const hts_idx_t *idx, void *fp, int fmt)
{
    int32_t i, size, is_be;
    int is_bgzf = (fmt != HTS_FMT_BAI);
    is_be = ed_is_big();
    if (is_be) {
        uint32_t x = idx->n;
        idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
    } else idx_write(is_bgzf, fp, &idx->n, 4);
    if (fmt == HTS_FMT_TBI && idx->l_meta) idx_write(is_bgzf, fp, idx->meta, idx->l_meta);
    for (i = 0; i < idx->n; ++i) {
        khint_t k;
        bidx_t *bidx = idx->bidx[i];
        lidx_t *lidx = &idx->lidx[i];
        // write binning index
        size = bidx? kh_size(bidx) : 0;
        if (is_be) { // big endian
            uint32_t x = size;
            idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
        } else idx_write(is_bgzf, fp, &size, 4);
        if (bidx == 0) goto write_lidx;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k) {
            bins_t *p;
            if (!kh_exist(bidx, k)) continue;
            p = &kh_value(bidx, k);
            if (is_be) { // big endian
                uint32_t x;
                x = kh_key(bidx, k); idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                if (fmt == HTS_FMT_CSI) {
                    uint64_t y = kh_val(bidx, k).loff;
                    idx_write(is_bgzf, fp, ed_swap_4p(&y), 8);
                }
                x = p->n; idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                swap_bins(p);
                idx_write(is_bgzf, fp, p->list, 16 * p->n);
                swap_bins(p);
            } else {
                idx_write(is_bgzf, fp, &kh_key(bidx, k), 4);
                if (fmt == HTS_FMT_CSI) idx_write(is_bgzf, fp, &kh_val(bidx, k).loff, 8);
                //int j;for(j=0;j<p->n;++j)fprintf(stderr,"%d,%llx,%d,%llx:%llx\n",kh_key(bidx,k),kh_val(bidx, k).loff,j,p->list[j].u,p->list[j].v);
                idx_write(is_bgzf, fp, &p->n, 4);
                idx_write(is_bgzf, fp, p->list, p->n << 4);
            }
        }
write_lidx:
        if (fmt != HTS_FMT_CSI) {
            if (is_be) {
                int32_t x = lidx->n;
                idx_write(is_bgzf, fp, ed_swap_4p(&x), 4);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
                for (x = 0; x < lidx->n; ++x) ed_swap_8p(&lidx->offset[x]);
            } else {
                idx_write(is_bgzf, fp, &lidx->n, 4);
                idx_write(is_bgzf, fp, lidx->offset, lidx->n << 3);
            }
        }
    }
    if (is_be) { // write the number of reads without coordinates
        uint64_t x = idx->n_no_coor;
        idx_write(is_bgzf, fp, &x, 8);
    } else idx_write(is_bgzf, fp, &idx->n_no_coor, 8);
}